

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortL.c
# Opt level: O2

void burstsortL(uchar **strings,size_t scnt)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  trierec *ptVar4;
  void *__ptr;
  ulong uVar5;
  TRIE *node;
  long lVar6;
  trierec *ptVar7;
  undefined8 *puVar8;
  int iVar9;
  trierec *ptVar10;
  uint uVar11;
  trierec *ptVar12;
  ulong uVar13;
  trierec *ptVar14;
  byte *pbVar15;
  
  __ptr = calloc(scnt,0x10);
  uVar5 = scnt & 0xffffffff;
  puVar8 = (undefined8 *)(uVar5 * 0x10 + (long)__ptr);
  while( true ) {
    uVar5 = uVar5 - 1;
    puVar8 = puVar8 + -2;
    if (uVar5 == 0xffffffffffffffff) break;
    *puVar8 = strings[uVar5];
  }
  node = (TRIE *)calloc(1,0xc00);
  uVar11 = 0;
  while( true ) {
    if (scnt <= uVar11) {
      bursttraverseL(node,strings,0,0);
      free(__ptr);
      return;
    }
    lVar6 = (ulong)uVar11 * 0x10;
    ptVar10 = (trierec *)((long)__ptr + lVar6);
    pbVar3 = *(byte **)((long)__ptr + lVar6);
    uVar5 = 1;
    ptVar14 = node;
    pbVar15 = pbVar3;
    while( true ) {
      uVar13 = (ulong)*pbVar15;
      uVar2 = ptVar14->counts[uVar13];
      if (-1 < (int)uVar2) break;
      ptVar14 = ptVar14->ptrs[uVar13];
      pbVar15 = pbVar3 + uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    }
    ptVar10->ptrs[1] = ptVar14->ptrs[uVar13];
    ptVar14->ptrs[uVar13] = ptVar10;
    if ((uVar13 != 0) && (ptVar14->counts[uVar13] = uVar2 + 1, 0x1fff < uVar2)) break;
LAB_001d56ce:
    uVar11 = uVar11 + 1;
  }
  ptVar14->counts[uVar13] = -1;
  ptVar7 = (trierec *)calloc(1,0xc00);
  do {
    bVar1 = *(byte *)((long)ptVar10->ptrs[0]->ptrs + uVar5);
    iVar9 = ptVar7->counts[bVar1];
    ptVar12 = ptVar10;
    ptVar4 = ptVar10->ptrs[1];
    do {
      ptVar10 = ptVar4;
      if (ptVar12 == (trierec *)0x0) {
        ptVar7->counts[bVar1] = iVar9;
        ptVar14->ptrs[uVar13] = ptVar7;
        ptVar14->counts[uVar13] = -1;
        goto LAB_001d56ce;
      }
      ptVar12->ptrs[1] = ptVar7->ptrs[bVar1];
      ptVar7->ptrs[bVar1] = ptVar12;
      iVar9 = iVar9 + 1;
      ptVar12 = ptVar10;
      ptVar4 = (trierec *)0x0;
    } while (ptVar10 == (trierec *)0x0);
    ptVar7->counts[bVar1] = iVar9;
  } while( true );
}

Assistant:

void
burstsortL(unsigned char *strings[], size_t scnt)
{
    TRIE	*root;
    LIST	*listnodes;
    unsigned int i;

    listnodes = (LIST *) calloc(scnt, sizeof(LIST));

    for( i=scnt; i-- ;)
        listnodes[i].word = strings[i];

    root = (TRIE *) calloc(1, sizeof(TRIE));

    (void) burstinsertL(root, listnodes, scnt);

    (void) bursttraverseL(root, strings, 0, 0);

    free(listnodes);

    return;
}